

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void handle_D_option(char *z)

{
  char cVar1;
  option_type oVar2;
  char *__s1;
  code *pcVar3;
  int iVar4;
  char **ppcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  FILE *__stream;
  s_options *psVar10;
  int n;
  char **ppcVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  char *pcStack_68;
  char **ppcStack_60;
  double dStack_58;
  char **ppcStack_50;
  
  lVar14 = (long)nDefine;
  nDefine = nDefine + 1;
  psVar10 = (s_options *)(lVar14 * 8 + 8);
  ppcVar5 = (char **)realloc(azDefine,(size_t)psVar10);
  if (ppcVar5 == (char **)0x0) {
    ppcVar11 = azDefine;
    azDefine = ppcVar5;
    handle_D_option_cold_2();
  }
  else {
    azDefine = ppcVar5;
    sVar6 = strlen(z);
    ppcVar11 = (char **)(long)((int)sVar6 + 1);
    pcVar7 = (char *)malloc((size_t)ppcVar11);
    ppcVar5[lVar14] = pcVar7;
    if (pcVar7 != (char *)0x0) {
      lVar14 = 0;
      do {
        cVar1 = z[lVar14];
        pcVar7[lVar14] = cVar1;
        lVar14 = lVar14 + 1;
      } while (cVar1 != '\0');
      for (; (*pcVar7 != '\0' && (*pcVar7 != '=')); pcVar7 = pcVar7 + 1) {
      }
      *pcVar7 = '\0';
      return;
    }
  }
  handle_D_option_cold_1();
  sVar6 = strlen((char *)ppcVar11);
  ppcVar5 = (char **)(long)((int)sVar6 + 1);
  pcVar7 = (char *)malloc((size_t)ppcVar5);
  user_templatename = pcVar7;
  if (pcVar7 != (char *)0x0) {
    lVar14 = 0;
    do {
      cVar1 = *(char *)((long)ppcVar11 + lVar14);
      pcVar7[lVar14] = cVar1;
      lVar14 = lVar14 + 1;
    } while (cVar1 != '\0');
    return;
  }
  handle_T_option_cold_1();
  g_argv = ppcVar5;
  op = psVar10;
  errstream = (FILE *)__stream;
  if ((((ppcVar5 != (char **)0x0) && (psVar10 != (s_options *)0x0)) && (*ppcVar5 != (char *)0x0)) &&
     (pcVar7 = ppcVar5[1], pcVar7 != (char *)0x0)) {
    lVar14 = 1;
    iVar12 = 0;
    ppcStack_60 = ppcVar5;
    ppcStack_50 = ppcVar11;
    do {
      psVar10 = op;
      ppcVar5 = g_argv;
      n = (int)lVar14;
      if ((*pcVar7 == '-') || (*pcVar7 == '+')) {
        pcVar7 = op->label;
        if (pcVar7 == (char *)0x0) {
          lVar13 = 0;
        }
        else {
          pcVar8 = g_argv[lVar14];
          ppcVar11 = &op[1].label;
          lVar13 = 0;
          do {
            sVar6 = strlen(pcVar7);
            iVar4 = strncmp(pcVar8 + 1,pcVar7,(long)(int)sVar6);
            if (iVar4 == 0) break;
            lVar13 = lVar13 + 1;
            pcVar7 = *ppcVar11;
            ppcVar11 = ppcVar11 + 4;
          } while (pcVar7 != (char *)0x0);
        }
        if (psVar10[lVar13].label == (char *)0x0) {
          if (__stream == (FILE *)0x0) {
LAB_00104e2b:
            iVar4 = 1;
          }
          else {
            pcVar7 = "%sundefined option.\n";
LAB_00104e06:
            fprintf(__stream,pcVar7,emsg);
            iVar4 = 1;
            errline(n,1,(FILE *)__stream);
          }
        }
        else {
          psVar10 = psVar10 + lVar13;
          pcVar3 = (code *)psVar10->arg;
          iVar4 = 0;
          if (pcVar3 != (code *)0x0) {
            oVar2 = psVar10->type;
            if (oVar2 == OPT_FSTR) {
              (*pcVar3)(ppcVar5[lVar14] + 2);
            }
            else if (oVar2 == OPT_FFLAG) {
              (*pcVar3)();
            }
            else {
              if (oVar2 != OPT_FLAG) {
                if (__stream == (FILE *)0x0) goto LAB_00104e2b;
                pcVar7 = "%smissing argument on switch.\n";
                goto LAB_00104e06;
              }
              *(uint *)pcVar3 = (uint)(*ppcVar5[lVar14] == '-');
            }
          }
        }
        iVar12 = iVar12 + iVar4;
      }
      else {
        pcVar7 = strchr(pcVar7,0x3d);
        if (pcVar7 != (char *)0x0) {
          pcVar8 = strchr(ppcVar5[lVar14],0x3d);
          *pcVar8 = '\0';
          psVar10 = op;
          pcVar7 = op->label;
          if (pcVar7 == (char *)0x0) {
            lVar13 = 0;
          }
          else {
            __s1 = ppcVar5[lVar14];
            ppcVar5 = &op[1].label;
            lVar13 = 0;
            do {
              iVar4 = strcmp(__s1,pcVar7);
              if (iVar4 == 0) break;
              lVar13 = lVar13 + 1;
              pcVar7 = *ppcVar5;
              ppcVar5 = ppcVar5 + 4;
            } while (pcVar7 != (char *)0x0);
          }
          *pcVar8 = '=';
          if (psVar10[lVar13].label == (char *)0x0) {
            iVar4 = 1;
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"%sundefined option.\n",emsg);
              errline(n,0,(FILE *)__stream);
            }
          }
          else {
            oVar2 = psVar10[lVar13].type;
            dVar15 = 0.0;
            if (oVar2 - OPT_FLAG < 8) {
              pcVar8 = pcVar8 + 1;
              switch(oVar2) {
              default:
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"%soption requires an argument.\n",emsg);
                  errline(n,0,(FILE *)__stream);
                  dVar15 = 0.0;
                }
                break;
              case OPT_INT:
              case OPT_FINT:
                iVar4 = 0;
                uVar9 = strtol(pcVar8,&pcStack_68,0);
                pcVar7 = pcStack_68;
                if ((*pcStack_68 != '\0') && (iVar4 = 1, __stream != (FILE *)0x0)) {
                  fprintf(__stream,"%sillegal character in integer argument.\n",emsg);
                  errline(n,(int)pcVar7 - *(int *)(g_argv + lVar14),(FILE *)__stream);
                }
                pcVar8 = (char *)0x0;
                dVar15 = 0.0;
                goto LAB_00104f0d;
              case OPT_DBL:
              case OPT_FDBL:
                dVar15 = strtod(pcVar8,&pcStack_68);
                pcVar7 = pcStack_68;
                if (*pcStack_68 == '\0') goto LAB_00104f08;
                if (__stream != (FILE *)0x0) {
                  dStack_58 = dVar15;
                  fprintf(__stream,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar7 - *(int *)(g_argv + lVar14),(FILE *)__stream);
                  dVar15 = dStack_58;
                }
                break;
              case OPT_STR:
              case OPT_FSTR:
                goto switchD_00104d67_caseD_4;
              }
              uVar9 = 0;
              iVar4 = 1;
              pcVar8 = (char *)0x0;
            }
            else {
LAB_00104f08:
              pcVar8 = (char *)0x0;
switchD_00104d67_caseD_4:
              uVar9 = 0;
              iVar4 = 0;
            }
LAB_00104f0d:
            switch(op[lVar13].type) {
            case OPT_INT:
              *(int *)op[lVar13].arg = (int)uVar9;
              break;
            case OPT_DBL:
              *(double *)op[lVar13].arg = dVar15;
              break;
            case OPT_STR:
              *(char **)op[lVar13].arg = pcVar8;
              break;
            case OPT_FINT:
              (*(code *)op[lVar13].arg)(uVar9 & 0xffffffff);
              break;
            case OPT_FDBL:
              (*(code *)op[lVar13].arg)();
              break;
            case OPT_FSTR:
              (*(code *)op[lVar13].arg)(pcVar8);
            }
          }
          iVar12 = iVar4 + iVar12;
        }
      }
      pcVar7 = g_argv[lVar14 + 1];
      lVar14 = lVar14 + 1;
    } while (pcVar7 != (char *)0x0);
    if (0 < iVar12) {
      fprintf(__stream,"Valid command line options for \"%s\" are:\n",*ppcStack_60);
      OptPrint();
      exit(1);
    }
  }
  return;
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  lemon_strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}